

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

IfcVector3 * __thiscall
Assimp::IFC::anon_unknown_9::Circle::Eval
          (IfcVector3 *__return_storage_ptr__,Circle *this,IfcFloat u)

{
  double f;
  double dVar1;
  aiVector3t<double> local_78;
  aiVector3t<double> local_60;
  aiVector3t<double> local_48;
  aiVector3t<double> local_30;
  double local_18;
  IfcFloat u_local;
  Circle *this_local;
  
  local_18 = -((this->super_Conic).super_Curve.conv)->angle_scale * u;
  f = *(double *)&(this->entity->super_IfcConic).field_0x60;
  u_local = (IfcFloat)this;
  dVar1 = cos(local_18);
  ::operator*(&local_60,dVar1,(this->super_Conic).p);
  dVar1 = ::sin(local_18);
  ::operator*(&local_78,dVar1,(this->super_Conic).p + 1);
  ::operator+(&local_48,&local_60,&local_78);
  ::operator*(&local_30,f,&local_48);
  ::operator+(__return_storage_ptr__,&(this->super_Conic).location,&local_30);
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 Eval(IfcFloat u) const {
        u = -conv.angle_scale * u;
        return location + static_cast<IfcFloat>(entity.Radius)*(static_cast<IfcFloat>(std::cos(u))*p[0] +
            static_cast<IfcFloat>(std::sin(u))*p[1]);
    }